

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::FileJavaPackage_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FileDescriptor *file)

{
  bool bVar1;
  FileOptions *pFVar2;
  ulong uVar3;
  string *psVar4;
  FileDescriptor *file_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pFVar2 = FileDescriptor::options((FileDescriptor *)this);
  bVar1 = FileOptions::has_java_package(pFVar2);
  if (bVar1) {
    pFVar2 = FileDescriptor::options((FileDescriptor *)this);
    psVar4 = FileOptions::java_package_abi_cxx11_(pFVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar4);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(anonymous_namespace)::kDefaultPackage);
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
      }
      psVar4 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)this);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string FileJavaPackage(const FileDescriptor* file) {
  string result;

  if (file->options().has_java_package()) {
    result = file->options().java_package();
  } else {
    result = kDefaultPackage;
    if (!file->package().empty()) {
      if (!result.empty()) result += '.';
      result += file->package();
    }
  }


  return result;
}